

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O2

CPU embree::getCPUModel(void)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  CPU CVar8;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  getCPUVendor_abi_cxx11_();
  bVar5 = std::operator!=(&bStack_28,"GenuineIntel");
  std::__cxx11::string::~string((string *)&bStack_28);
  if ((bVar5) || (piVar1 = (int *)cpuid_basic_info(0), *piVar1 < 1))
  goto switchD_0015916a_caseD_618;
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar3 = *puVar2;
  uVar7 = uVar3 >> 8 & 0xf;
  uVar6 = uVar3 >> 0xc & 0xf0;
  uVar4 = (uVar3 >> 0x14 & 0xff) + 0xf;
  if (uVar7 != 0xf) {
    uVar4 = uVar7;
  }
  uVar9 = 0;
  if (uVar7 == 0xf) {
    uVar9 = uVar6;
  }
  if (uVar7 == 6) {
    uVar9 = uVar6;
  }
  uVar9 = uVar9 | uVar3 >> 4 & 0xf;
  switch(uVar4 * 0x100 + uVar9) {
  case 0x63a:
    CVar8 = CORE_IVY_BRIDGE;
    break;
  case 0x63b:
  case 0x640:
  case 0x641:
  case 0x642:
  case 0x643:
  case 0x644:
  case 0x648:
  case 0x649:
  case 0x64a:
  case 0x64b:
  case 0x64c:
  case 0x64d:
  case 0x650:
  case 0x651:
  case 0x652:
  case 0x653:
  case 0x654:
    goto switchD_0015916a_caseD_618;
  case 0x63c:
  case 0x645:
  case 0x646:
    CVar8 = CORE_HASWELL;
    break;
  case 0x63d:
  case 0x647:
    CVar8 = CORE_BROADWELL;
    break;
  case 0x63e:
    CVar8 = XEON_IVY_BRIDGE;
    break;
  case 0x63f:
    CVar8 = XEON_HASWELL;
    break;
  case 0x64e:
switchD_00159156_caseD_64e:
    CVar8 = CORE_SKY_LAKE;
    break;
  case 0x64f:
  case 0x656:
    CVar8 = XEON_BROADWELL;
    break;
  case 0x655:
    CVar8 = XEON_SKY_LAKE;
    break;
  case 0x657:
    CVar8 = XEON_PHI_KNIGHTS_LANDING;
    break;
  default:
    uVar9 = uVar9 | uVar4 * 0x100;
    switch(uVar9) {
    case 0x617:
switchD_0015916a_caseD_617:
      CVar8 = CORE2;
      break;
    case 0x61a:
    case 0x61d:
    case 0x61e:
    case 0x61f:
    case 0x625:
    case 0x62c:
    case 0x62e:
      CVar8 = NEHALEM;
      break;
    case 0x62a:
    case 0x62d:
    case 0x62f:
      CVar8 = SANDY_BRIDGE;
      break;
    default:
      if (uVar9 - 0x67d < 2) {
        return CORE_ICE_LAKE;
      }
      if (uVar9 == 0x60e) {
        return CORE1;
      }
      if (uVar9 == 0x60f) goto switchD_0015916a_caseD_617;
      if (uVar9 == 0x65e) goto switchD_00159156_caseD_64e;
      if (uVar9 == 0x666) {
        return CORE_CANNON_LAKE;
      }
      if ((uVar9 == 0x66a) || (uVar9 == 0x66c)) {
        return XEON_ICE_LAKE;
      }
      if (uVar9 == 0x685) {
        return XEON_PHI_KNIGHTS_MILL;
      }
      if (uVar9 == 0x6a6) {
        return CORE_COMET_LAKE;
      }
      if ((uVar9 == 0x68e) || (uVar9 == 0x69e)) {
        return CORE_KABY_LAKE;
      }
      if (uVar9 == 0x6a5) {
        return CORE_COMET_LAKE;
      }
      if (uVar9 == 0x68c) {
        return CORE_TIGER_LAKE;
      }
    case 0x618:
    case 0x619:
    case 0x61b:
    case 0x61c:
    case 0x620:
    case 0x621:
    case 0x622:
    case 0x623:
    case 0x624:
    case 0x626:
    case 0x627:
    case 0x628:
    case 0x629:
    case 0x62b:
switchD_0015916a_caseD_618:
      CVar8 = UNKNOWN;
    }
  }
  return CVar8;
}

Assistant:

CPU getCPUModel() 
  {
#if defined(__X86_ASM__)
    if (getCPUVendor() != "GenuineIntel")
      return CPU::UNKNOWN;
    
    int out[4];
    __cpuid(out, 0);
    if (out[0] < 1) return CPU::UNKNOWN;
    __cpuid(out, 1);

    /* please see CPUID documentation for these formulas */
    uint32_t family_ID          = (out[0] >>  8) & 0x0F;
    uint32_t extended_family_ID = (out[0] >> 20) & 0xFF;
    
    uint32_t model_ID           = (out[0] >>  4) & 0x0F;
    uint32_t extended_model_ID  = (out[0] >> 16) & 0x0F;
    
    uint32_t DisplayFamily = family_ID;
    if (family_ID == 0x0F)
      DisplayFamily += extended_family_ID;
    
    uint32_t DisplayModel = model_ID;
    if (family_ID == 0x06 || family_ID == 0x0F)
      DisplayModel += extended_model_ID << 4;

    uint32_t DisplayFamily_DisplayModel = (DisplayFamily << 8) + (DisplayModel << 0);

    // Data from Intel® 64 and IA-32 Architectures, Volume 4, Chapter 2, Table 2-1 (CPUID Signature Values of DisplayFamily_DisplayModel)
    if (DisplayFamily_DisplayModel == 0x067D) return CPU::CORE_ICE_LAKE;
    if (DisplayFamily_DisplayModel == 0x067E) return CPU::CORE_ICE_LAKE;
    if (DisplayFamily_DisplayModel == 0x068C) return CPU::CORE_TIGER_LAKE;
    if (DisplayFamily_DisplayModel == 0x06A5) return CPU::CORE_COMET_LAKE;
    if (DisplayFamily_DisplayModel == 0x06A6) return CPU::CORE_COMET_LAKE;
    if (DisplayFamily_DisplayModel == 0x0666) return CPU::CORE_CANNON_LAKE;
    if (DisplayFamily_DisplayModel == 0x068E) return CPU::CORE_KABY_LAKE;
    if (DisplayFamily_DisplayModel == 0x069E) return CPU::CORE_KABY_LAKE;
    if (DisplayFamily_DisplayModel == 0x066A) return CPU::XEON_ICE_LAKE;
    if (DisplayFamily_DisplayModel == 0x066C) return CPU::XEON_ICE_LAKE;
    if (DisplayFamily_DisplayModel == 0x0655) return CPU::XEON_SKY_LAKE;
    if (DisplayFamily_DisplayModel == 0x064E) return CPU::CORE_SKY_LAKE;
    if (DisplayFamily_DisplayModel == 0x065E) return CPU::CORE_SKY_LAKE;
    if (DisplayFamily_DisplayModel == 0x0656) return CPU::XEON_BROADWELL;
    if (DisplayFamily_DisplayModel == 0x064F) return CPU::XEON_BROADWELL;
    if (DisplayFamily_DisplayModel == 0x0647) return CPU::CORE_BROADWELL;
    if (DisplayFamily_DisplayModel == 0x063D) return CPU::CORE_BROADWELL;
    if (DisplayFamily_DisplayModel == 0x063F) return CPU::XEON_HASWELL;
    if (DisplayFamily_DisplayModel == 0x063C) return CPU::CORE_HASWELL;
    if (DisplayFamily_DisplayModel == 0x0645) return CPU::CORE_HASWELL;
    if (DisplayFamily_DisplayModel == 0x0646) return CPU::CORE_HASWELL;
    if (DisplayFamily_DisplayModel == 0x063E) return CPU::XEON_IVY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x063A) return CPU::CORE_IVY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x062D) return CPU::SANDY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x062F) return CPU::SANDY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x062A) return CPU::SANDY_BRIDGE;
    if (DisplayFamily_DisplayModel == 0x062E) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x0625) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x062C) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x061E) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x061F) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x061A) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x061D) return CPU::NEHALEM;
    if (DisplayFamily_DisplayModel == 0x0617) return CPU::CORE2;
    if (DisplayFamily_DisplayModel == 0x060F) return CPU::CORE2;
    if (DisplayFamily_DisplayModel == 0x060E) return CPU::CORE1;

    if (DisplayFamily_DisplayModel == 0x0685) return CPU::XEON_PHI_KNIGHTS_MILL;
    if (DisplayFamily_DisplayModel == 0x0657) return CPU::XEON_PHI_KNIGHTS_LANDING;
    
#elif defined(__ARM_NEON)
    return CPU::ARM;
#endif
    
    return CPU::UNKNOWN;
  }